

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

bool units::cleanUnitString(string *unit_string,uint64_t match_flags)

{
  byte *pbVar1;
  _Iter_negate<units::cleanSpaces(std::__cxx11::string&,bool)::__0> _Var2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  char cVar4;
  byte bVar5;
  char cVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  size_type sVar10;
  size_t sVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  size_type sVar13;
  size_type sVar14;
  difference_type dVar15;
  undefined7 extraout_var;
  const_iterator cVar16;
  char *pcVar17;
  ulong uVar18;
  pointer pcVar19;
  char *pcVar20;
  char *pcVar21;
  char *pcVar22;
  char cVar23;
  size_type sVar24;
  ulong uVar25;
  size_t sVar26;
  size_t sVar27;
  ulong uVar28;
  size_type __pos;
  pointer pcVar29;
  bool bVar30;
  long lVar31;
  undefined1 *__it;
  __const_iterator _Var32;
  size_t *in_R9;
  size_type sVar33;
  pointer pcVar34;
  undefined8 uVar35;
  byte bVar36;
  _Iter_negate<units::cleanSpaces(std::__cxx11::string&,bool)::__0> *this;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  double dVar41;
  precise_unit pVar42;
  size_type sStackY_5d0;
  char in_stack_fffffffffffffa42;
  allocator<char> local_5b5;
  uint local_5b4;
  ulong local_5b0;
  uint64_t local_5a8;
  undefined1 local_599;
  size_type local_598;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_590;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_588;
  size_t reploc;
  size_type local_578;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_530;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_470;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_430;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_370;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_330;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_270;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_230;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_170;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_130;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  
  local_578 = unit_string->_M_string_length;
  local_5a8 = match_flags;
  if ((cleanUnitString(std::__cxx11::string&,unsigned_long)::spchar_abi_cxx11_ == '\0') &&
     (iVar8 = __cxa_guard_acquire(&cleanUnitString(std::__cxx11::string&,unsigned_long)::
                                   spchar_abi_cxx11_), iVar8 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&str," \t\n\r",(allocator<char> *)&reploc);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &cleanUnitString(std::__cxx11::string&,unsigned_long)::spchar_abi_cxx11_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&str,'\0');
    std::__cxx11::string::~string((string *)&str);
    __cxa_atexit(std::__cxx11::string::~string,
                 &cleanUnitString(std::__cxx11::string&,unsigned_long)::spchar_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&cleanUnitString(std::__cxx11::string&,unsigned_long)::spchar_abi_cxx11_);
    match_flags = local_5a8;
  }
  uVar28 = 0;
  uVar7 = (byte)(unit_string->_M_dataplus)._M_p[unit_string->_M_string_length - 1] - 0x2a;
  if ((uVar7 < 0x35) && ((0x10000000000021U >> ((ulong)uVar7 & 0x3f) & 1) != 0)) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string);
    uVar28 = 1;
  }
  sVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           find_first_not_of(unit_string,
                             &cleanUnitString(std::__cxx11::string&,unsigned_long)::
                              spchar_abi_cxx11_,0);
  if (sVar10 != 0) {
    if (sVar10 == 0xffffffffffffffff) {
      unit_string->_M_string_length = 0;
      *(unit_string->_M_dataplus)._M_p = '\0';
      return true;
    }
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,0,
               sVar10);
    sVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             find_first_not_of(unit_string,
                               &cleanUnitString(std::__cxx11::string&,unsigned_long)::
                                spchar_abi_cxx11_,0);
    uVar28 = 1;
  }
  pcVar19 = (unit_string->_M_dataplus)._M_p;
  bVar38 = pcVar19[sVar10] == '/';
  local_5b4 = (uint)CONCAT71((int7)((ulong)pcVar19 >> 8),bVar38);
  if (bVar38) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
               sVar10,1,'1');
    uVar28 = 1;
  }
  if ((match_flags >> 0x24 & 1) == 0) {
    pcVar19 = (unit_string->_M_dataplus)._M_p;
    sVar24 = unit_string->_M_string_length;
    pcVar17 = pcVar19 + sVar24;
    pcVar20 = pcVar19 + 1;
    for (lVar31 = (long)sVar24 >> 2; 0 < lVar31; lVar31 = lVar31 + -1) {
      if (pcVar20[-1] < '\0') {
        pcVar20 = pcVar20 + -1;
        goto LAB_0033b132;
      }
      if (*pcVar20 < '\0') goto LAB_0033b132;
      if (pcVar20[1] < '\0') {
        pcVar20 = pcVar20 + 1;
        goto LAB_0033b132;
      }
      if (pcVar20[2] < '\0') {
        pcVar20 = pcVar20 + 2;
        goto LAB_0033b132;
      }
      pcVar20 = pcVar20 + 4;
      sVar24 = sVar24 - 4;
    }
    pcVar22 = pcVar20 + -1;
    if (sVar24 == 1) {
LAB_0033bdf4:
      pcVar20 = pcVar22;
      if (-1 < *pcVar22) {
        pcVar20 = pcVar17;
      }
LAB_0033b132:
      if (pcVar20 != pcVar17) {
        local_5b0 = CONCAT44(local_5b0._4_4_,(int)uVar28);
        uVar35 = 0;
        for (lVar31 = 0; lVar31 != 0x420; lVar31 = lVar31 + 0x10) {
          pcVar17 = *(char **)((long)&unicodeReplacement(std::__cxx11::string&)::ucodeReplacements +
                              lVar31);
          sVar10 = 0;
          while (sVar10 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                                    (unit_string,pcVar17,sVar10), sVar10 != 0xffffffffffffffff) {
            sVar11 = strlen(pcVar17);
            if ((sVar10 == 0 || sVar11 != 1) ||
               ((byte)(unit_string->_M_dataplus)._M_p[sVar10 - 1] < 0xc1)) {
              pcVar20 = *(char **)((long)&DAT_004ab158 + lVar31);
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      unit_string,sVar10,sVar11,pcVar20);
              if (sVar10 == 0) {
                sVar10 = 0;
              }
              else if ((unit_string->_M_dataplus)._M_p[sVar10 - 1] == '\\') {
                sVar10 = sVar10 - 1;
                CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::erase((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        unit_string,sVar10,1);
              }
              sVar11 = strlen(pcVar20);
              sVar10 = sVar11 + sVar10;
              uVar35 = CONCAT71((int7)((ulong)pcVar20 >> 8),1);
            }
            else {
              sVar10 = sVar10 + 1;
            }
          }
        }
        uVar28 = CONCAT71((int7)((ulong)uVar35 >> 8),(byte)uVar35 | (byte)local_5b0) & 0xffffffff;
      }
    }
    else {
      if (sVar24 == 3) {
        pcVar21 = pcVar20;
        pcVar20 = pcVar22;
        if (-1 < *pcVar22) goto LAB_0033bde5;
        goto LAB_0033b132;
      }
      pcVar21 = pcVar22;
      if (sVar24 == 2) {
LAB_0033bde5:
        pcVar20 = pcVar21;
        if (-1 < *pcVar21) {
          pcVar22 = pcVar21 + 1;
          goto LAB_0033bdf4;
        }
        goto LAB_0033b132;
      }
    }
    for (lVar31 = 0; lVar31 != 0x40; lVar31 = lVar31 + 0x10) {
      pcVar17 = *(char **)((long)&cleanUnitString::earlyCodeReplacements._M_elems[0].first + lVar31)
      ;
      sVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                         (unit_string,pcVar17,0);
      while (sVar10 != 0xffffffffffffffff) {
        sVar11 = strlen(pcVar17);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                sVar10,sVar11,
                *(char **)((long)&cleanUnitString::earlyCodeReplacements._M_elems[0].second + lVar31
                          ));
        sVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 find(unit_string,pcVar17,sVar10 + 1);
        uVar28 = CONCAT71((int7)(uVar28 >> 8),1);
      }
    }
    sVar10 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             find_first_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           unit_string,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &cleanUnitString(std::__cxx11::string&,unsigned_long)::spchar_abi_cxx11_,
                           0);
    if (sVar10 == 0xffffffffffffffff) {
      local_598 = 0xffffffffffffffff;
    }
    else {
      local_5b0 = CONCAT44(local_5b0._4_4_,(int)uVar28);
      reploc = 0;
      iVar8 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      unit_string,0,4,"per ");
      if (iVar8 == 0) {
        reploc = 2;
        pbVar12 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             unit_string,0,4,"1/");
        local_5b4 = (uint)CONCAT71((int7)((ulong)pbVar12 >> 8),1);
      }
      bVar38 = ReplaceStringInPlace(unit_string," per ",5,"/",(int)&reploc,in_R9);
      sVar27 = reploc;
      local_598 = CONCAT71(local_598._1_7_,bVar38);
      if ((reploc != 0) &&
         (sVar10 = CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                             ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              unit_string,'(',reploc), sVar10 != 0xffffffffffffffff)) {
        sVar13 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            unit_string,'/',sVar27);
        do {
          __pos = sVar13 + 1;
          sVar14 = CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                             ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              unit_string,'/',__pos);
          sVar13 = sVar14;
          if (sVar10 < sVar14) {
            if (sVar14 == 0xffffffffffffffff) {
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        unit_string,')');
            }
            else {
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              insert((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     unit_string,sVar14,1,')');
            }
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            insert((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                   __pos,1,'(');
            sVar13 = sVar14 + 2;
          }
        } while (sVar14 != 0xffffffffffffffff);
      }
      sVar10 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::find_first_not_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)unit_string," \t",0);
      sVar10 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::find_first_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               unit_string," \t",sVar10 + 1);
      sVar13 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::find_first_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               unit_string,"*/",0);
      uVar7 = local_5b4;
      if (sVar10 == 2) {
        if (unit_string->_M_string_length < 5) {
          sVar10 = 2;
        }
        else {
          sVar10 = 2;
          sVar14 = CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   find_first_not_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)unit_string," \t",2);
          if (((sVar14 != 0xffffffffffffffff) && (sVar13 == 0xffffffffffffffff)) &&
             ((unit_string->_M_dataplus)._M_p[sVar14] != '(')) {
            sVar10 = 2;
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            substr((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&str,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                   0,2);
            bVar38 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&str,"fl");
            if ((!bVar38) &&
               (pVar42 = get_unit(&str,local_5a8),
               pVar42.base_units_ != (unit_data)0xfa94a488 || !NAN(pVar42.multiplier_))) {
              (unit_string->_M_dataplus)._M_p[2] = '_';
              pVar42 = get_unit(unit_string,local_5a8);
              if (pVar42.base_units_ == (unit_data)0xfa94a488 && NAN(pVar42.multiplier_)) {
                (unit_string->_M_dataplus)._M_p[2] = '*';
              }
              sVar10 = CLI::std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                       find_first_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)unit_string," \t",3);
            }
            std::__cxx11::string::~string((string *)&str);
          }
        }
      }
      local_5b4 = CONCAT31((int3)(uVar7 >> 8),(byte)uVar7 | (byte)local_598);
      for (; sVar10 != 0xffffffffffffffff;
          sVar10 = CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find_first_of
                             ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              unit_string," \t",sVar10 + 1)) {
        if (sVar10 + 2 == unit_string->_M_string_length) {
          if (sVar13 == 0xffffffffffffffff) {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            substr((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&str,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                   0,sVar10);
            pVar42 = get_unit((string *)&str,local_5a8);
            if ((!NAN(pVar42.multiplier_)) || (pVar42.base_units_ != (unit_data)0xfa94a488)) {
              (unit_string->_M_dataplus)._M_p[sVar10] = '_';
              pVar42 = get_unit(unit_string,local_5a8);
              if (pVar42.base_units_ == (unit_data)0xfa94a488 && NAN(pVar42.multiplier_)) {
                (unit_string->_M_dataplus)._M_p[sVar10] = '*';
              }
              std::__cxx11::string::~string((string *)&str);
              break;
            }
            std::__cxx11::string::~string((string *)&str);
          }
          shortStringReplacement_abi_cxx11_(in_stack_fffffffffffffa42);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                  sVar10 + 1,1,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&str);
LAB_0033b5a4:
          std::__cxx11::string::~string((string *)&str);
        }
        else {
          uVar7 = (byte)(unit_string->_M_dataplus)._M_p[sVar10 + 1] - 0x20;
          if ((uVar7 < 0x3f) && ((0x400000000000c401U >> ((ulong)uVar7 & 0x3f) & 1) != 0)) {
            shortStringReplacement_abi_cxx11_(in_stack_fffffffffffffa42);
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string
                    ,sVar10 + 1,1,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&str);
            goto LAB_0033b5a4;
          }
        }
      }
      sVar10 = 0;
      while ((sVar10 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                                 (unit_string," of ",sVar10), sVar10 != 0xffffffffffffffff &&
             ((sVar24 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                        find_first_not_of(unit_string,
                                          &cleanUnitString(std::__cxx11::string&,unsigned_long)::
                                           spchar_abi_cxx11_,sVar10 + 4),
              sVar24 == 0xffffffffffffffff ||
              ((cVar6 = (unit_string->_M_dataplus)._M_p[sVar24], cVar6 != '(' && (cVar6 != '['))))))
            ) {
        sVar10 = sVar10 + 3;
      }
      if ((cleanSpaces(std::__cxx11::string&,bool)::spaceChars_abi_cxx11_ == '\0') &&
         (iVar8 = __cxa_guard_acquire(&cleanSpaces(std::__cxx11::string&,bool)::
                                       spaceChars_abi_cxx11_), iVar8 != 0)) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&str," \t\n\r",&local_5b5);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       cleanSpaces(std::__cxx11::string&,bool)::spaceChars_abi_cxx11_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&str,
                       '\0');
        std::__cxx11::string::~string((string *)&str);
        __cxa_atexit(std::__cxx11::string::~string,
                     cleanSpaces(std::__cxx11::string&,bool)::spaceChars_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&cleanSpaces(std::__cxx11::string&,bool)::spaceChars_abi_cxx11_);
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&str,"square ",&local_5b5);
      bVar38 = isolatePriorModifier(unit_string,&str,'d','D');
      std::__cxx11::string::~string((string *)&str);
      std::__cxx11::string::string<std::allocator<char>>((string *)&str,"cubic ",&local_5b5);
      bVar5 = isolatePriorModifier(unit_string,&str,'_','-');
      local_598 = sVar10;
      std::__cxx11::string::~string((string *)&str);
      std::__cxx11::string::string<std::allocator<char>>((string *)&str," squared",&local_5b5);
      sVar10 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      unit_string,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&str,0);
      bVar36 = 0;
      if (sVar10 != 0xffffffffffffffff) {
        sVar24 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 find_last_not_of(unit_string,' ',sVar10 - 1);
        sVar13 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find_last_of
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            unit_string," */",sVar24);
        bVar36 = 0;
        if ((sVar13 != 0) && (bVar36 = 0, sVar13 < unit_string->_M_string_length)) {
          pcVar19 = (unit_string->_M_dataplus)._M_p;
          if (pcVar19[sVar13] == ' ') {
            cVar6 = pcVar19[sVar13 + 1];
            bVar40 = true;
            bVar30 = bVar40;
            if ((cVar6 != '*') && (cVar6 != '/')) {
              bVar30 = pcVar19[sVar13 - 1] == '/' || pcVar19[sVar13 - 1] == '*';
            }
            bVar36 = (cVar6 == '*' || cVar6 == '/') | bVar30;
            bVar36 = cVar6 == ')' | bVar36 | bVar36;
            bVar30 = (bool)(cVar6 == '-' | bVar36 | bVar36);
            bVar39 = bVar40;
            if (!bVar30) {
              bVar39 = pcVar19[sVar13 - 1] == ')';
            }
            bVar39 = (bool)(bVar39 | bVar30);
            if (!bVar39) {
              bVar40 = pcVar19[sVar13 - 1] == '-';
            }
            if (!bVar40 && !bVar39) {
              sVar14 = CLI::std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rfind
                                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)unit_string,'/',sVar10);
              if (sVar14 < sVar10) {
                local_590._M_current._0_1_ = bVar5;
                CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::insert((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         unit_string,sVar14 + 1,1,'(');
                sVar10 = CLI::std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)unit_string,'/',sVar10 + 1);
                if (sVar10 == 0xffffffffffffffff) {
                  CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             unit_string,')');
                }
                else {
                  CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             unit_string,sVar10,1,')');
                }
                bVar36 = 1;
                bVar5 = (byte)local_590._M_current;
                if (sVar10 <= sVar13) goto LAB_0033b7eb;
                sVar13 = sVar13 + 1;
              }
              (unit_string->_M_dataplus)._M_p[sVar13] = '*';
              bVar36 = 1;
              goto LAB_0033b7eb;
            }
          }
          bVar36 = 0;
        }
      }
LAB_0033b7eb:
      bVar36 = bVar38 | bVar5 | bVar36;
      std::__cxx11::string::~string((string *)&str);
      sStackY_5d0 = 0;
      uVar28 = local_5b0 & 0xffffffff;
      uVar18 = (ulong)local_5b4;
LAB_0033b80e:
      while( true ) {
        sStackY_5d0 = CLI::std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                      find_first_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)unit_string,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)cleanSpaces(std::__cxx11::string&,bool)::
                                       spaceChars_abi_cxx11_,sStackY_5d0);
        uVar7 = (uint)uVar18;
        if (sStackY_5d0 != 0) break;
LAB_0033b851:
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                   sStackY_5d0,1);
        bVar36 = 1;
        uVar18 = (ulong)uVar7;
        uVar28 = local_5b0 & 0xffffffff;
      }
      if (sStackY_5d0 == 0xffffffffffffffff) goto LAB_0033bb39;
      if ((uVar18 & 1) != 0) {
LAB_0033b834:
        uVar7 = (uint)CONCAT71((int7)(uVar28 >> 8),1);
        if ((unit_string->_M_dataplus)._M_p[sStackY_5d0 - 1] != '.') goto LAB_0033b851;
        sStackY_5d0 = sStackY_5d0 + 1;
        bVar36 = 1;
        uVar28 = local_5b0 & 0xffffffff;
        goto LAB_0033b80e;
      }
      __it = cleanSpaces(std::__cxx11::string&,bool)::spaceChars_abi_cxx11_;
      sVar24 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               find_first_not_of(unit_string,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)cleanSpaces(std::__cxx11::string&,bool)::spaceChars_abi_cxx11_,
                                 sStackY_5d0);
      if (sVar24 != 0xffffffffffffffff) {
        if (sStackY_5d0 != 1) goto LAB_0033b904;
        pcVar19 = (unit_string->_M_dataplus)._M_p;
        if (((byte)pcVar19[sVar24] - 0x2a < 0x35) &&
           ((0x10000000400021U >> ((ulong)((byte)pcVar19[sVar24] - 0x2a) & 0x3f) & 1) != 0)) {
          sStackY_5d0 = 1;
LAB_0033b92a:
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          erase((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                sStackY_5d0,1);
LAB_0033b92f:
          bVar36 = 1;
          uVar18 = 0;
        }
        else if (unit_string->_M_string_length < 8) {
LAB_0033b8c2:
          pcVar19[1] = '*';
          bVar36 = 1;
          sStackY_5d0 = 1;
          uVar18 = CONCAT71((int7)(uVar18 >> 8),1);
        }
        else {
          __it = (char *)0x2a;
          sVar10 = CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                             ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              unit_string,'*',0);
          if (sVar10 == 0xffffffffffffffff) {
            __it = "/^";
            sVar10 = CLI::std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                     find_first_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)unit_string,"/^",sVar24);
            if (sVar10 < 9) {
              pcVar19 = (unit_string->_M_dataplus)._M_p;
              goto LAB_0033b8c2;
            }
          }
LAB_0033b904:
          this = (_Iter_negate<units::cleanSpaces(std::__cxx11::string&,bool)::__0> *)
                 (unit_string->_M_dataplus)._M_p;
          _Var2 = this[sStackY_5d0 - 1];
          local_590._M_current = (char *)this;
          if (_Var2 == (_Iter_negate<units::cleanSpaces(std::__cxx11::string&,bool)::__0>)0x2f)
          goto LAB_0033b92a;
          if (_Var2 == (_Iter_negate<units::cleanSpaces(std::__cxx11::string&,bool)::__0>)0x2e) {
            sStackY_5d0 = sStackY_5d0 + 1;
            goto LAB_0033b92f;
          }
          if ((_Var2 == (_Iter_negate<units::cleanSpaces(std::__cxx11::string&,bool)::__0>)0x2a) ||
             ((sVar24 < unit_string->_M_string_length &&
              ((this[sVar24] ==
                (_Iter_negate<units::cleanSpaces(std::__cxx11::string&,bool)::__0>)0x2f ||
               (this[sVar24] ==
                (_Iter_negate<units::cleanSpaces(std::__cxx11::string&,bool)::__0>)0x2a))))))
          goto LAB_0033b92a;
          local_588._M_current = (char *)(this + sStackY_5d0);
          sVar10 = sStackY_5d0;
          local_5b4 = uVar7;
          for (lVar31 = (long)sStackY_5d0 >> 2; uVar25 = local_5b0, _Var37._M_current = (char *)this
              , 0 < lVar31; lVar31 = lVar31 + -1) {
            bVar38 = __gnu_cxx::__ops::
                     _Iter_negate<units::cleanSpaces(std::__cxx11::string&,bool)::$_0>::operator()
                               (this,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      )__it);
            if (bVar38) {
LAB_0033ba16:
              uVar18 = (ulong)local_5b4;
              uVar25 = local_5b0;
              goto LAB_0033ba1f;
            }
            bVar38 = __gnu_cxx::__ops::
                     _Iter_negate<units::cleanSpaces(std::__cxx11::string&,bool)::$_0>::operator()
                               (this + 1,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          )__it);
            _Var37._M_current = (char *)(this + 1);
            if (bVar38) goto LAB_0033ba16;
            bVar38 = __gnu_cxx::__ops::
                     _Iter_negate<units::cleanSpaces(std::__cxx11::string&,bool)::$_0>::operator()
                               (this + 2,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          )__it);
            _Var37._M_current = (char *)(this + 2);
            if (bVar38) goto LAB_0033ba16;
            bVar38 = __gnu_cxx::__ops::
                     _Iter_negate<units::cleanSpaces(std::__cxx11::string&,bool)::$_0>::operator()
                               (this + 3,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          )__it);
            _Var37._M_current = (char *)(this + 3);
            if (bVar38) goto LAB_0033ba16;
            this = this + 4;
            sVar10 = sVar10 - 4;
          }
          uVar18 = (ulong)local_5b4;
          if (sVar10 == 1) {
LAB_0033bab9:
            _Var3._M_current = local_588._M_current;
            bVar38 = __gnu_cxx::__ops::
                     _Iter_negate<units::cleanSpaces(std::__cxx11::string&,bool)::$_0>::operator()
                               (this,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      )__it);
            _Var37._M_current = (char *)this;
            if (!bVar38) {
              _Var37._M_current = _Var3._M_current;
            }
LAB_0033ba1f:
            uVar28 = uVar25 & 0xffffffff;
            if (_Var37._M_current == local_588._M_current) goto LAB_0033ba8a;
            str._M_dataplus._M_p._0_1_ = 0x2f;
            dVar15 = std::
                     __count_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                               (local_590,local_588,(_Iter_equals_val<const_char>)&str);
            if (((dVar15 != 1) ||
                (sVar24 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rfind
                                    (unit_string,"/sq",sStackY_5d0), sVar24 != 0xffffffffffffffff))
               || (sVar24 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rfind
                                      (unit_string,"/cu",sStackY_5d0), sVar24 != 0xffffffffffffffff)
               ) {
LAB_0033ba7a:
              if (sStackY_5d0 == 0) {
                uVar7 = 0;
                goto LAB_0033b851;
              }
              goto LAB_0033b834;
            }
            sVar24 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::find_first_not_of(unit_string,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)cleanSpaces(std::__cxx11::string&,bool)::
                                            spaceChars_abi_cxx11_,sStackY_5d0);
            sVar10 = CLI::std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                     find_first_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)unit_string,anon_var_dwarf_1c72687,sStackY_5d0);
            if (((sVar24 == 0xffffffffffffffff) || (sVar10 == sVar24)) ||
               (pcVar19 = (unit_string->_M_dataplus)._M_p,
               (byte)(pcVar19[sStackY_5d0 - 1] - 0x30U) < 10)) goto LAB_0033ba7a;
            pcVar19[sStackY_5d0] = '*';
          }
          else {
            if (sVar10 == 2) {
LAB_0033baa4:
              bVar38 = __gnu_cxx::__ops::
                       _Iter_negate<units::cleanSpaces(std::__cxx11::string&,bool)::$_0>::operator()
                                 (this,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        )__it);
              _Var37._M_current = (char *)this;
              if (!bVar38) {
                this = this + 1;
                goto LAB_0033bab9;
              }
              goto LAB_0033ba1f;
            }
            uVar28 = local_5b0 & 0xffffffff;
            if (sVar10 == 3) {
              __it = local_588._M_current;
              bVar38 = __gnu_cxx::__ops::
                       _Iter_negate<units::cleanSpaces(std::__cxx11::string&,bool)::$_0>::operator()
                                 (this,local_588);
              if (!bVar38) {
                this = this + 1;
                goto LAB_0033baa4;
              }
              goto LAB_0033ba1f;
            }
LAB_0033ba8a:
            *local_588._M_current = '*';
          }
          bVar36 = 1;
          uVar18 = CONCAT71((int7)(uVar18 >> 8),1);
        }
        goto LAB_0033b80e;
      }
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                 sStackY_5d0,0xffffffffffffffff);
      bVar36 = 1;
LAB_0033bb39:
      if (unit_string->_M_string_length == 0) {
        return true;
      }
      uVar28 = CONCAT71((int7)(uVar28 >> 8),(byte)uVar28 | bVar36);
    }
    sVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                       (unit_string,"10*",0);
    while (match_flags = local_5a8, sVar10 != 0xffffffffffffffff) {
      uVar18 = sVar10 + 3;
      if (uVar18 < unit_string->_M_string_length) {
        pcVar19 = (unit_string->_M_dataplus)._M_p;
        bVar5 = pcVar19[uVar18];
        if ((((byte)(bVar5 - 0x30) < 10) ||
            ((bVar5 < 0x2f && ((0x680000000000U >> ((ulong)(uint)bVar5 & 0x3f) & 1) != 0)))) &&
           ((sVar10 == 0 ||
            ((bVar5 = pcVar19[sVar10 - 1], 9 < (byte)(bVar5 - 0x30) &&
             (((0x3a < bVar5 - 0x2b ||
               ((0x40000000400000dU >> ((ulong)(bVar5 - 0x2b) & 0x3f) & 1) == 0)) ||
              ((sVar10 != 1 && ((bVar5 == 0x2e && ((byte)(pcVar19[sVar10 - 2] - 0x3aU) < 0xf6)))))))
             ))))) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          substr((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&str,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                 uVar18,0xffffffffffffffff);
          if ((str._M_string_length != 0) &&
             (uVar25 = (ulong)((*str._M_dataplus._M_p - 0x2bU & 0xfd) == 0),
             (byte)(str._M_dataplus._M_p[uVar25] - 0x30U) < 10)) {
            uVar25 = uVar25 + 1;
            do {
              if (str._M_string_length <= uVar25) goto LAB_0033bc85;
              pbVar1 = (byte *)(str._M_dataplus._M_p + uVar25);
              uVar25 = uVar25 + 1;
            } while ((byte)(*pbVar1 - 0x30) < 10);
            uVar7 = *pbVar1 - 0x2e;
            if ((((0x37 < uVar7) || ((0x80000000800001U >> ((ulong)uVar7 & 0x3f) & 1) == 0)) ||
                (str._M_string_length <= uVar25)) ||
               ((9 < (byte)(str._M_dataplus._M_p[uVar25] - 0x30U) &&
                ((str._M_dataplus._M_p[uVar25] - 0x2bU & 0xfd) != 0)))) {
LAB_0033bc85:
              uVar9 = CLI::std::__cxx11::stoi
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&str,(size_t *)0x0,10);
              uVar7 = -uVar9;
              if (0 < (int)uVar9) {
                uVar7 = uVar9;
              }
              if (uVar7 < 0x27) {
                CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          unit_string,sVar10,3,"1e");
              }
            }
          }
          std::__cxx11::string::~string((string *)&str);
        }
      }
      sVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                         (unit_string,"10*",uVar18);
    }
  }
  else {
    local_598 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                find(unit_string,"of(",0);
  }
  if ((*(unit_string->_M_dataplus)._M_p == '(') &&
     (removeOuterParenthesis(unit_string), unit_string->_M_string_length == 0)) {
    return true;
  }
  if ((match_flags >> 0x24 & 1) == 0) {
    bVar38 = ReplaceStringInPlace(unit_string,"**",2,"^",(int)&str,in_R9);
    uVar28 = CONCAT71(extraout_var,bVar38 | (byte)uVar28) & 0xffffffff;
  }
  if (((uint)match_flags >> 9 & 1) != 0) {
    if ((ciConversion(std::__cxx11::string&)::ciConversions_abi_cxx11_ == '\0') &&
       (iVar8 = __cxa_guard_acquire(&ciConversion(std::__cxx11::string&)::ciConversions_abi_cxx11_),
       iVar8 != 0)) {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&str,(char (*) [2])0x35fd6a,(char (*) [2])0x37d432);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
                (&local_530,(char (*) [2])0x386b84,(char (*) [2])0x383f0c);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
                (&local_4f0,(char (*) [2])0x35ff4a,(char (*) [2])0x36634a);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_4b0,(char (*) [3])"MM",(char (*) [3])0x386643);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_470,(char (*) [3])"NM",(char (*) [3])"nm");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_430,(char (*) [3])0x35ddaa,(char (*) [3])0x3824b1);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_3f0,(char (*) [3])"GS",(char (*) [3])"Gs");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[4],_true>
                (&local_3b0,(char (*) [3])"GL",(char (*) [4])"Gal");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_370,(char (*) [3])"MG",(char (*) [3])"mg");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[4],_const_char_(&)[4],_true>
                (&local_330,(char (*) [4])"[G]",(char (*) [4])"[g]");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_2f0,(char (*) [3])"PG",(char (*) [3])"pg");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_2b0,(char (*) [3])0x381745,(char (*) [3])0x38312e);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_270,(char (*) [3])0x38177e,(char (*) [3])0x35fee4);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_230,(char (*) [3])0x386965,(char (*) [3])0x3855de);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_1f0,(char (*) [3])0x383afc,(char (*) [3])0x383bc8);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[4],_const_char_(&)[4],_true>
                (&local_1b0,(char (*) [4])"RAD",(char (*) [4])0x382caa);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[8],_true>
                (&local_170,(char (*) [3])"GB",(char (*) [8])"gilbert");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_130,(char (*) [3])"WB",(char (*) [3])"Wb");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_f0,(char (*) [3])0x37a661,(char (*) [3])"cP");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_b0,(char (*) [3])"EV",(char (*) [3])"eV");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_70,(char (*) [3])"PT",(char (*) [3])"pT");
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_Hashtable<std::pair<std::__cxx11::string_const,std::__cxx11::string>const*>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)ciConversion(std::__cxx11::string&)::ciConversions_abi_cxx11_,&str,
                 &stack0xffffffffffffffd0,0,&reploc,&local_5b5,&local_599);
      lVar31 = 0x500;
      do {
        CLI::std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)((long)&str._M_dataplus._M_p + lVar31));
        lVar31 = lVar31 + -0x40;
      } while (lVar31 != -0x40);
      __cxa_atexit(std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::~unordered_map,ciConversion(std::__cxx11::string&)::ciConversions_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&ciConversion(std::__cxx11::string&)::ciConversions_abi_cxx11_);
      match_flags = local_5a8;
    }
    pcVar19 = (unit_string->_M_dataplus)._M_p;
    sVar24 = unit_string->_M_string_length;
    for (sVar33 = 0; sVar24 != sVar33; sVar33 = sVar33 + 1) {
      iVar8 = toupper((int)pcVar19[sVar33]);
      pcVar19[sVar33] = (char)iVar8;
    }
    cVar16 = std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)ciConversion(std::__cxx11::string&)::ciConversions_abi_cxx11_,unit_string);
    if (cVar16.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      pcVar17 = (unit_string->_M_dataplus)._M_p;
      if (*pcVar17 == 'P') {
        cVar6 = 'p';
LAB_0033bdb3:
        *pcVar17 = cVar6;
        pcVar17 = (unit_string->_M_dataplus)._M_p;
      }
      else if (*pcVar17 == 'M') {
        cVar6 = 'm';
        goto LAB_0033bdb3;
      }
      sVar24 = unit_string->_M_string_length;
      if (pcVar17[sVar24 - 1] == 'M') {
        if (sVar24 == 3) {
          dVar41 = getPrefixMultiplier2Char(*pcVar17,pcVar17[1]);
        }
        else {
          if (sVar24 != 2) goto LAB_0033be20;
          dVar41 = getPrefixMultiplier(*pcVar17);
        }
        if ((dVar41 != 0.0) || (NAN(dVar41))) {
          pcVar17[sVar24 - 1] = 'm';
        }
      }
    }
    else {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                ((long)cVar16.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                       ._M_cur + 0x28));
    }
LAB_0033be20:
    sVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                       (unit_string,"/S",0);
    if (sVar10 != 0xffffffffffffffff) {
      (unit_string->_M_dataplus)._M_p[sVar10 + 1] = 's';
    }
    sVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                       (unit_string,"/G",0);
    uVar28 = CONCAT71((int7)(uVar28 >> 8),1);
    if (sVar10 != 0xffffffffffffffff) {
      (unit_string->_M_dataplus)._M_p[sVar10 + 1] = 'g';
    }
  }
  if ((match_flags >> 0x24 & 1) == 0) {
    local_5b0 = CONCAT44(local_5b0._4_4_,(int)uVar28);
    sVar10 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             rfind((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                   '<',0xffffffffffffffff);
    if (sVar10 != 0xffffffffffffffff) {
LAB_0033bea8:
      sVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                         (unit_string,"<sup>",0);
      if (sVar10 != 0xffffffffffffffff) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                sVar10,5,"^");
        sVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 find(unit_string,"</sup>",0);
        if (sVar10 == 0xffffffffffffffff) goto LAB_0033bee9;
        sStackY_5d0 = 6;
        goto LAB_0033bf05;
      }
      goto LAB_0033bf30;
    }
LAB_0033bf98:
    uVar28 = local_5b0 & 0xffffffff;
    for (lVar31 = 0; match_flags = local_5a8, lVar31 != 0x210; lVar31 = lVar31 + 0x10) {
      pcVar17 = *(char **)((long)&cleanUnitString::allCodeReplacements._M_elems[0].first + lVar31);
      sVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                         (unit_string,pcVar17,0);
      while (sVar10 != 0xffffffffffffffff) {
        sVar11 = strlen(pcVar17);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                sVar10,sVar11,
                *(char **)((long)&cleanUnitString::allCodeReplacements._M_elems[0].second + lVar31))
        ;
        sVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 find(unit_string,pcVar17,sVar10 + 1);
        uVar28 = CONCAT71((int7)(uVar28 >> 8),1);
      }
    }
  }
  uVar18 = unit_string->_M_string_length;
  if ((1 < uVar18) &&
     (pcVar19 = (unit_string->_M_dataplus)._M_p, (pcVar19[uVar18 - 1] & 0xfeU) == 0x32)) {
    _Var32._M_current = pcVar19 + (uVar18 - 1);
    if (((pcVar19[uVar18 - 2] == '-') || (pcVar19[uVar18 - 2] == '+')) && (uVar18 != 2)) {
      _Var32._M_current = pcVar19 + (uVar18 - 2);
    }
    if (9 < (byte)(_Var32._M_current[-1] - 0x30U)) {
      uVar7 = (byte)_Var32._M_current[-1] - 0x2a;
      if (uVar7 < 0x3c) {
        if ((0x81000000800003aU >> ((ulong)uVar7 & 0x3f) & 1) == 0) {
          if ((ulong)uVar7 != 0) goto LAB_0033c838;
          _Var32._M_current[-1] = '^';
        }
      }
      else {
LAB_0033c838:
        if (*_Var32._M_current == '+') {
          *_Var32._M_current = '^';
        }
        else {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          insert((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                 _Var32,'^');
        }
      }
    }
  }
  if ((match_flags >> 0x24 & 1) != 0) goto LAB_0033c55d;
  sVar10 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           rfind((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                 '.',0xffffffffffffffff);
  if ((sVar10 != 0xffffffffffffffff) &&
     (9 < (byte)((unit_string->_M_dataplus)._M_p[sVar10 + 1] - 0x30U))) {
    sVar10 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                  '.',0);
    if (sVar10 == 0xffffffffffffffff) {
      uVar28 = 0;
LAB_0033c1e1:
      iVar8 = 0;
      sVar10 = 2;
      sVar13 = 0;
      local_5b0 = uVar28;
      do {
        sVar14 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            unit_string,'.',sVar13);
        if (sVar14 == 0) {
          if (1 < unit_string->_M_string_length) {
            pcVar17 = (unit_string->_M_dataplus)._M_p;
            if ((byte)(pcVar17[1] - 0x30U) < 10) {
              iVar8 = iVar8 + 1;
            }
            else {
              if ((char)uVar28 == '\0') {
                while ((*pcVar17 == '.' || (*pcVar17 == ' '))) {
                  CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             unit_string,0,1);
                  pcVar17 = (unit_string->_M_dataplus)._M_p;
                }
                sVar13 = 0xffffffffffffffff;
                goto LAB_0033c2c9;
              }
              *pcVar17 = '*';
            }
          }
          sVar13 = 0;
        }
        else {
          if (sVar14 == 0xffffffffffffffff) goto LAB_0033c2d1;
          pcVar19 = (unit_string->_M_dataplus)._M_p;
          sVar13 = sVar14;
          if ((byte)(pcVar19[sVar14 - 1] - 0x30U) < 10) {
            if ((byte)(pcVar19[sVar14 + 1] - 0x30U) < 10) {
LAB_0033c25c:
              iVar8 = iVar8 + 1;
              goto LAB_0033c2c9;
            }
          }
          else if (pcVar19[sVar14 - 1] == '*') goto LAB_0033c25c;
          if ((char)uVar28 == '\0') {
            sVar13 = sVar14 - 1;
            while ((pcVar19[sVar14] == '.' || (uVar28 = local_5b0, pcVar19[sVar14] == ' '))) {
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              erase((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string
                    ,sVar14,1);
              pcVar19 = (unit_string->_M_dataplus)._M_p;
            }
          }
          else {
            pcVar19[sVar14] = '*';
          }
        }
LAB_0033c2c9:
        sVar13 = sVar13 + 1;
      } while( true );
    }
    cVar6 = '\0';
LAB_0033c0c9:
    cVar4 = cVar6;
    if (sVar10 == 0) {
      if ((1 < unit_string->_M_string_length) &&
         (9 < (byte)((unit_string->_M_dataplus)._M_p[1] - 0x30U))) {
        cVar4 = '\x01';
      }
    }
    else {
      if (sVar10 == 0xffffffffffffffff) goto LAB_0033c1d7;
      pcVar19 = (unit_string->_M_dataplus)._M_p;
      if ((byte)(pcVar19[sVar10 - 1] - 0x30U) < 10) {
        cVar23 = pcVar19[sVar10 + 1];
        if ((byte)(cVar23 - 0x30U) < 10) goto LAB_0033c13e;
      }
      else {
        if (pcVar19[sVar10 - 1] == '*') {
          cVar6 = '\x02';
LAB_0033c1d7:
          uVar28 = (ulong)(cVar6 == '\x01');
          goto LAB_0033c1e1;
        }
        cVar23 = pcVar19[sVar10 + 1];
      }
      cVar6 = '\x02';
      if ((cVar23 == ' ') || (cVar4 = '\x01', sVar10 == unit_string->_M_string_length - 1))
      goto LAB_0033c1d7;
    }
LAB_0033c13e:
    cVar6 = cVar4;
    sVar10 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                  '.',sVar10 + 1);
    goto LAB_0033c0c9;
  }
  goto LAB_0033c3cc;
LAB_0033bee9:
  sVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                     (unit_string,"<\\/sup>",0);
  if (sVar10 != 0xffffffffffffffff) {
    sStackY_5d0 = 8;
LAB_0033bf05:
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
               sVar10,sStackY_5d0,"");
  }
  goto LAB_0033bea8;
LAB_0033bf30:
  sVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                     (unit_string,"<sub>",0);
  if (sVar10 != 0xffffffffffffffff) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
               sVar10,5,"_");
    sVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                       (unit_string,"</sub>",0);
    if (sVar10 == 0xffffffffffffffff) goto LAB_0033bf71;
    sStackY_5d0 = 6;
    goto LAB_0033bf8d;
  }
  goto LAB_0033bf98;
LAB_0033bf71:
  sVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                     (unit_string,"<\\/sub>",0);
  if (sVar10 != 0xffffffffffffffff) {
    sStackY_5d0 = 8;
LAB_0033bf8d:
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
               sVar10,sStackY_5d0,"");
  }
  goto LAB_0033bf30;
LAB_0033c2d1:
  if (1 < iVar8) {
    iVar8 = 0;
    uVar28 = 0;
    sVar13 = 0;
    do {
      sVar13 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      unit_string,'.',sVar13);
      while( true ) {
        if (sVar13 == 0xffffffffffffffff) goto LAB_0033c33d;
        pcVar19 = (unit_string->_M_dataplus)._M_p;
        sVar13 = sVar13 + 1;
        do {
          sVar14 = sVar13;
          if (pcVar19[sVar14] == '.') goto LAB_0033c32e;
          sVar13 = sVar14 + 1;
        } while ((byte)(pcVar19[sVar14] - 0x30U) < 10);
        sVar13 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            unit_string,'.',sVar14 + 1);
        pcVar19 = (unit_string->_M_dataplus)._M_p;
        if (pcVar19[sVar14] == '.') break;
        iVar8 = iVar8 + 1;
      }
LAB_0033c32e:
      sVar13 = sVar14 + 1;
      pcVar19[sVar14] = '*';
    } while( true );
  }
LAB_0033c33d:
  if (0 < iVar8) {
    uVar28 = 0;
    while (sVar10 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               unit_string,'.',sVar10), sVar10 != 0xffffffffffffffff) {
      pcVar19 = (unit_string->_M_dataplus)._M_p;
      sVar13 = sVar10;
      do {
        sVar13 = sVar13 - 1;
        if (sVar13 == 0) goto LAB_0033c389;
        bVar5 = pcVar19[sVar13];
      } while ((byte)(bVar5 - 0x30) < 10);
      if ((bVar5 | 0x20) == 0x65) {
        pcVar19[sVar10] = '*';
      }
LAB_0033c389:
      sVar10 = sVar10 + 1;
    }
  }
  uVar28 = CONCAT71((int7)(uVar28 >> 8),1);
  if ((((uint)local_5a8 >> 10 & 1) != 0) &&
     (sVar10 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::rfind((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       unit_string,'/',0xffffffffffffffff), sVar10 != 0xffffffffffffffff)) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
               sVar10 + 1,1,'(');
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,')')
    ;
  }
LAB_0033c3cc:
  sVar10 = 0;
  while (sVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  find(unit_string,"()",sVar10), sVar10 != 0xffffffffffffffff) {
    if ((sVar10 + 2 < unit_string->_M_string_length) &&
       ((unit_string->_M_dataplus)._M_p[sVar10 + 2] == '^')) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                 sVar10,2,"*1");
    }
    else {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                 sVar10,2);
    }
  }
  clearEmptySegments(unit_string);
  sVar10 = 0;
  while (sVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  find(unit_string,"(1)^",sVar10), sVar10 != 0xffffffffffffffff) {
    pcVar19 = (unit_string->_M_dataplus)._M_p;
    cVar6 = pcVar19[sVar10 + 4];
    if ((cVar6 == '+') || (cVar6 == '-')) {
      uVar18 = unit_string->_M_string_length;
      if (uVar18 <= sVar10 + 5) {
        multiplyRep(unit_string,sVar10,5);
        break;
      }
      cVar6 = pcVar19[sVar10 + 5];
      sVar27 = 5;
    }
    else {
      uVar18 = unit_string->_M_string_length;
      sVar27 = 4;
    }
    while ((sVar26 = sVar27 + 1, (byte)(cVar6 - 0x30U) < 10 &&
           (sVar27 = sVar26, sVar10 + sVar26 < uVar18))) {
      cVar6 = pcVar19[sVar26 + sVar10];
    }
    multiplyRep(unit_string,sVar10,sVar27);
  }
  uVar18 = 0;
  while (sVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  find(unit_string,"^1",uVar18), sVar10 != 0xffffffffffffffff) {
    uVar18 = sVar10 + 2;
    if ((unit_string->_M_string_length <= uVar18) ||
       (9 < (byte)((unit_string->_M_dataplus)._M_p[uVar18] - 0x30U))) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                 sVar10,2);
      uVar18 = sVar10;
    }
  }
  sVar10 = 0;
  while (sVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  find(unit_string,"^(1)",sVar10), sVar10 != 0xffffffffffffffff) {
    multiplyRep(unit_string,sVar10,4);
  }
  if (unit_string->_M_string_length == 0) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,'1')
    ;
    return true;
  }
LAB_0033c55d:
  while ((unit_string->_M_string_length != 0 &&
         (((bVar5 = *(unit_string->_M_dataplus)._M_p, bVar5 - 0x29 < 2 || (bVar5 == 0x7d)) ||
          (bVar5 == 0x5d))))) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,0,1)
    ;
    if (unit_string->_M_string_length == 0) {
      return true;
    }
    uVar28 = CONCAT71((int7)(uVar28 >> 8),1);
    if (*(unit_string->_M_dataplus)._M_p == '(') {
      removeOuterParenthesis(unit_string);
    }
  }
  local_5b0 = CONCAT44(local_5b0._4_4_,(int)uVar28);
  sVar10 = 0;
LAB_0033c5c5:
  do {
    sVar13 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             find_first_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           unit_string,")]}",sVar10);
    if ((local_598 <= sVar13) || (unit_string->_M_string_length - 1 <= sVar13)) goto LAB_0033c698;
    sVar14 = sVar13 + 1;
    pcVar19 = (unit_string->_M_dataplus)._M_p;
    bVar5 = pcVar19[sVar13 + 1];
    sVar10 = sVar14;
  } while (((bVar5 - 0x29 < 0x36) &&
           ((0x30000000200043U >> ((ulong)(bVar5 - 0x29) & 0x3f) & 1) != 0)) || (bVar5 == 0x7d));
  if (bVar5 == 0x7b) {
    if (pcVar19[sVar13] != '}') goto LAB_0033c5c5;
  }
  else if (bVar5 == 0x6f) {
    sVar10 = sVar13 + 3;
    if (((unit_string->_M_string_length <= sVar10) || (pcVar19[sVar13 + 2] != 'f')) ||
       ((cVar6 = pcVar19[sVar10], cVar6 == ')' || ((cVar6 == '}' || (cVar6 == ']')))))) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                 sVar14,1,'*');
    }
    goto LAB_0033c5c5;
  }
  if (pcVar19[sVar13 - 1] != '\\') {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
               sVar14,1,'*');
    sVar10 = sVar13 + 2;
  }
  goto LAB_0033c5c5;
LAB_0033c698:
  sVar10 = 0;
  while( true ) {
    sVar10 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                  '^',sVar10);
    sVar24 = unit_string->_M_string_length;
    uVar7 = (uint)local_5b0;
    if ((local_598 <= sVar10) || (sVar24 - 3 <= sVar10)) break;
    pcVar19 = (unit_string->_M_dataplus)._M_p;
    uVar28 = sVar10 + 1;
    if (pcVar19[sVar10 + 1] != '-') {
      uVar28 = sVar10;
    }
    if (uVar28 < sVar24 - 3) {
      for (uVar18 = 1;
          (uVar25 = uVar18 + uVar28, 0xf5 < (byte)(pcVar19[uVar18 + uVar28] - 0x3aU) &&
          (uVar25 <= sVar24 - 1)); uVar18 = uVar18 + 1) {
      }
      if (sVar24 - 1 < uVar25) goto LAB_0033c743;
      if (1 < uVar18) {
        uVar7 = (byte)pcVar19[uVar18 + uVar28] - 0x2a;
        if (((0x3b < uVar7) || ((0x810000008000021U >> ((ulong)uVar7 & 0x3f) & 1) == 0)) &&
           (pcVar19[uVar18 + uVar28] != 0)) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          insert((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                 uVar25,1,'*');
        }
      }
    }
    sVar10 = uVar28 + 2;
  }
  if (sVar24 != 0) {
LAB_0033c743:
    _Var32._M_current = (unit_string->_M_dataplus)._M_p;
    if (*_Var32._M_current == '/') {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                 _Var32,'1');
      uVar7 = 1;
    }
  }
  if ((local_5a8 >> 0x24 & 1) == 0) {
    pcVar19 = (pointer)CLI::std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)unit_string,'{',0);
    while (pcVar34 = pcVar19, pcVar34 != (pointer)0xffffffffffffffff) {
      str._M_dataplus._M_p = pcVar34 + 1;
      bVar38 = segmentcheck(unit_string,'}',(size_t *)&str);
      pcVar19 = (pointer)0xffffffffffffffff;
      if (bVar38) {
        pcVar19 = (unit_string->_M_dataplus)._M_p;
        pcVar29 = str._M_dataplus._M_p + -2;
        for (; pcVar29 != pcVar34; pcVar34 = pcVar34 + 1) {
          iVar8 = tolower((int)pcVar34[(long)(pcVar19 + 1)]);
          pcVar34[(long)(pcVar19 + 1)] = (char)iVar8;
        }
        pcVar19 = (pointer)CLI::std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)unit_string,'{',str._M_dataplus._M_p);
      }
    }
  }
  if ((uVar7 & 1) == 0) {
    return unit_string->_M_string_length != local_578;
  }
  return true;
}

Assistant:

static bool cleanUnitString(std::string& unit_string, std::uint64_t match_flags)
{
    auto slen = unit_string.size();
    bool skipcodereplacement = ((match_flags & skip_code_replacements) != 0);
    static UNITS_CPP14_CONSTEXPR_OBJECT std::array<ckpair, 4>
        earlyCodeReplacements{{
            ckpair{"degree", "deg"},
            ckpair{"Degree", "deg"},
            ckpair{"degs ", "deg"},
            ckpair{"deg ", "deg"},
        }};

    static UNITS_CPP14_CONSTEXPR_OBJECT std::array<ckpair, 33>
        allCodeReplacements{{
            ckpair{"sq.", "square"},
            ckpair{"cu.", "cubic"},
            ckpair{"U.S.", "US"},
            ckpair{"10^", "1e"},
            ckpair{"10-", "1e-"},
            ckpair{"^+", "^"},
            ckpair{"'s", "s"},
            ckpair{"ampere", "amp"},
            ckpair{"Ampere", "amp"},
            ckpair{"metre", "meter"},
            ckpair{"Metre", "meter"},
            ckpair{"litre", "liter"},
            ckpair{"Litre", "liter"},
            ckpair{"B.Th.U.", "BTU"},
            ckpair{"B.T.U.", "BTU"},
            ckpair{"Britishthermalunits", "BTU"},
            ckpair{"Britishthermalunitat", "BTU"},
            ckpair{"Britishthermalunit", "BTU"},
            ckpair{"BThU", "BTU"},
            ckpair{"-US", "US"},
            ckpair{"--", "*"},
            // -- is either a double negative or a separator, so make it a
            // multiplier so it doesn't get erased and then converted to a
            // power
            ckpair{"\\\\", "\\\\*"},
            // \\ is always considered a segment terminator so it won't be
            // misinterpreted as a known escape sequence
            ckpair{"perunit", "pu"},
            ckpair{"percent", "%"},
            ckpair{"per-unit", "pu"},
            ckpair{"per unit ", "pu"},
            ckpair{"/square*", "/square"},
            ckpair{"/cubic*", "/cubic"},
            ckpair{"Hz^0.5", "rootHertz"},
            ckpair{"Hz^.5", "rootHertz"},
            ckpair{"Hz^(1/2)", "rootHertz"},
            ckpair{"Hz^1/2", "rootHertz"},
            ckpair{u8"\u221AHz", "rootHertz"},
        }};

    static const std::string spchar = std::string(" \t\n\r") + '\0';
    bool changed = false;
    bool skipMultiply = false;
    std::size_t skipMultiplyInsertionAfter{std::string::npos};
    char tail = unit_string.back();
    if (tail == '^' || tail == '*' || tail == '/') {
        unit_string.pop_back();
        changed = true;
    }
    auto c = unit_string.find_first_not_of(spchar);
    if (c == std::string::npos) {
        unit_string.clear();
        return true;
    }
    if (c != 0) {
        unit_string.erase(0, c);
        c = unit_string.find_first_not_of(spchar);
        changed = true;
    }
    if (unit_string[c] == '/') {
        unit_string.insert(c, 1, '1');
        changed = true;
        skipMultiply = true;
    }
    if (!skipcodereplacement) {
        // Check for unicode or extended characters
        if (std::any_of(unit_string.begin(), unit_string.end(), [](char x) {
                return (static_cast<std::uint8_t>(x) & 0x80U) != 0;
            })) {
            if (unicodeReplacement(unit_string)) {
                changed = true;
            }
        }

        // some code replacement that needs to be done before single character
        // and space replacements
        for (const auto& acode : earlyCodeReplacements) {
            auto fnd = unit_string.find(acode.first);
            while (fnd != std::string::npos) {
                changed = true;
                unit_string.replace(fnd, strlen(acode.first), acode.second);
                fnd = unit_string.find(acode.first, fnd + 1);
            }
        }

        if (unit_string.find_first_of(spchar) != std::string::npos) {
            // deal with some particular string with a space in them
            std::size_t reploc{0};
            // clean up some "per" words
            if (unit_string.compare(0, 4, "per ") == 0) {
                reploc = 2;
                unit_string.replace(0, 4, "1/");
                skipMultiply = true;
            }
            if (ReplaceStringInPlace(unit_string, " per ", 5, "/", 1, reploc)) {
                skipMultiply = true;
            }
            if (reploc > 0) {
                auto ploc = unit_string.find_first_of('(', reploc);
                if (ploc != std::string::npos) {
                    auto fdiv = unit_string.find_first_of('/', reploc);
                    std::size_t ndiv{0};
                    do {
                        ndiv = unit_string.find_first_of('/', fdiv + 1);
                        if (ploc < ndiv) {
                            if (ndiv != std::string::npos) {
                                unit_string.insert(ndiv, 1, ')');
                            } else {
                                unit_string.push_back(')');
                            }
                            unit_string.insert(fdiv + 1, 1, '(');
                            fdiv = ndiv + 2;
                        } else {
                            fdiv = ndiv;
                        }
                    } while (ndiv != std::string::npos);
                }
            }
            checkShortUnits(unit_string, match_flags);
            auto fndP = unit_string.find(" of ");
            while (fndP != std::string::npos) {
                auto nchar = unit_string.find_first_not_of(spchar, fndP + 4);
                if (nchar != std::string::npos) {
                    if (unit_string[nchar] == '(' ||
                        unit_string[nchar] == '[') {
                        skipMultiplyInsertionAfter = fndP;
                        break;
                    }
                }
                fndP = unit_string.find(" of ", fndP + 3);
            }
            changed |= cleanSpaces(unit_string, skipMultiply);
            if (unit_string.empty()) {
                // LCOV_EXCL_START
                return true;
                // LCOV_EXCL_STOP
            }
        }

        checkPowerOf10(unit_string);
    } else {
        auto fndP = unit_string.find("of(");
        if (fndP != std::string::npos) {
            skipMultiplyInsertionAfter = fndP;
        }
    }
    if (unit_string.front() == '(') {
        removeOuterParenthesis(unit_string);
        if (unit_string.empty()) {
            return true;
        }
    }

    if (!skipcodereplacement) {
        // ** means power in some environments
        std::size_t loc{0};
        if (ReplaceStringInPlace(unit_string, "**", 2, "^", 1, loc)) {
            changed = true;
        }
    }
    if ((match_flags & case_insensitive) != 0) {
        ciConversion(unit_string);
        changed = true;
    }
    if (!skipcodereplacement) {
        // deal with some html stuff
        auto bloc = unit_string.find_last_of('<');
        if (bloc != std::string::npos) {
            htmlCodeReplacement(unit_string);
        }
        // some abbreviations and other problematic code replacements
        for (const auto& acode : allCodeReplacements) {
            auto fnd = unit_string.find(acode.first);
            while (fnd != std::string::npos) {
                changed = true;
                unit_string.replace(fnd, strlen(acode.first), acode.second);
                fnd = unit_string.find(acode.first, fnd + 1);
            }
        }
    }
    if (unit_string.size() >= 2) {
        auto eit = unit_string.end() - 1;
        if (*(eit) == '2' || *(eit) == '3') {
            if ((*(eit - 1) == '-' || *(eit - 1) == '+') &&
                unit_string.size() >= 3) {
                --eit;
            }
            if (!isDigitCharacter(*(eit - 1))) {
                switch (*(eit - 1)) {
                    case '^':
                    case 'e':
                    case 'E':
                    case '/':
                    case '+':
                    case '-':
                    case '.':
                        break;
                    case '*':
                        *(eit - 1) = '^';
                        break;
                    default:
                        if (eit[0] != '+') {
                            unit_string.insert(eit, '^');
                        } else {
                            *eit = '^';
                        }

                        break;
                }
            }
        }
    }
    if (!skipcodereplacement) {
        // handle dot notation for multiplication
        auto dotloc = unit_string.find_last_of('.');
        if (dotloc < std::string::npos) {
            // strings always have a null pointer at the end
            if (!isDigitCharacter(unit_string[dotloc + 1])) {
                cleanDotNotation(unit_string, match_flags);
                changed = true;
            }
        }

        // clear empty parenthesis
        auto fndP = unit_string.find("()");
        while (fndP != std::string::npos) {
            if (unit_string.size() > fndP + 2) {
                if (unit_string[fndP + 2] == '^') {
                    unit_string.replace(fndP, 2, "*1");
                } else {
                    unit_string.erase(fndP, 2);
                }
            } else {
                unit_string.erase(fndP, 2);
            }
            fndP = unit_string.find("()", fndP);
        }
        // clear empty brackets, this would indicate commodities but if
        // empty there is no commodity
        clearEmptySegments(unit_string);
        cleanUpPowersOfOne(unit_string);
        if (unit_string.empty()) {
            unit_string.push_back('1');
            return true;
        }
    }
    // remove leading *})],  equivalent of 1* but we don't need to process
    // that further
    while (!unit_string.empty() &&
           (unit_string.front() == '*' || unit_string.front() == '}' ||
            unit_string.front() == ')' || unit_string.front() == ']')) {
        unit_string.erase(0, 1);
        changed = true;
        if (unit_string.empty()) {
            return true;
        }
        // check for parenthesis again
        if (unit_string.front() == '(') {
            removeOuterParenthesis(unit_string);
        }
    }
    // inject multiplies after bracket terminators
    auto fnd = unit_string.find_first_of(")]}");
    while (fnd < unit_string.size() - 1 && fnd < skipMultiplyInsertionAfter) {
        switch (unit_string[fnd + 1]) {
            case '^':
            case '*':
            case '/':
            case ')':
            case ']':
            case '}':
            case '>':
                fnd = unit_string.find_first_of(")]}", fnd + 1);
                break;
            case 'o':  // handle special case of commodity modifier using
                       // "of"
                if (unit_string.size() > fnd + 3) {
                    auto tc2 = unit_string[fnd + 3];
                    if (unit_string[fnd + 2] == 'f' && tc2 != ')' &&
                        tc2 != ']' && tc2 != '}') {
                        fnd = unit_string.find_first_of(")]}", fnd + 3);
                        break;
                    }
                }
                unit_string.insert(fnd + 1, 1, '*');
                fnd = unit_string.find_first_of(")]}", fnd + 3);
                break;
            case '{':
                if (unit_string[fnd] != '}') {
                    fnd = unit_string.find_first_of(")]}", fnd + 1);
                    break;
                }
                /* FALLTHRU */
            default:
                if (unit_string[fnd - 1] == '\\') {  // ignore escape sequences
                    fnd = unit_string.find_first_of(")]}", fnd + 1);
                    break;
                }
                unit_string.insert(fnd + 1, 1, '*');
                fnd = unit_string.find_first_of(")]}", fnd + 2);
                break;
        }
    }
    // insert multiplies after ^#
    fnd = unit_string.find_first_of('^');
    while (fnd < unit_string.size() - 3 && fnd < skipMultiplyInsertionAfter) {
        if (unit_string[fnd + 1] == '-') {
            ++fnd;
        }
        if (fnd < unit_string.size() - 3) {
            std::size_t seq = 1;
            auto p = unit_string[fnd + seq];
            while (p >= '0' && p <= '9' &&
                   fnd + seq <= unit_string.size() - 1U) {
                ++seq;
                p = unit_string[fnd + seq];
            }
            if (fnd + seq > unit_string.size() - 1U) {
                break;
            }
            if (seq > 1) {
                auto c2 = unit_string[fnd + seq];
                if (c2 != '\0' && c2 != '*' && c2 != '/' && c2 != '^' &&
                    c2 != 'e' && c2 != 'E') {
                    unit_string.insert(fnd + seq, 1, '*');
                }
            }
        }
        fnd = unit_string.find_first_of('^', fnd + 2);
    }

    // this still might occur from code replacements or other removal
    if (!unit_string.empty() && unit_string.front() == '/') {
        unit_string.insert(unit_string.begin(), '1');
        changed = true;
    }
    if (!skipcodereplacement) {  // make everything inside {} lower case
        auto bloc = unit_string.find_first_of('{');
        while (bloc != std::string::npos) {
            auto ind = bloc + 1;
            if (segmentcheck(unit_string, '}', ind)) {
                std::transform(
                    unit_string.begin() + bloc + 1,
                    unit_string.begin() + ind - 1,
                    unit_string.begin() + bloc + 1,
                    ::tolower);
                bloc = unit_string.find_first_of('{', ind);
            } else {
                bloc = std::string::npos;
            }
        }
    }
    return (changed || unit_string.size() != slen);
}